

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  U32 *pUVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  U32 UVar11;
  U32 *pUVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  bool bVar25;
  
  pBVar1 = (ms->window).base;
  uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  uVar17 = (long)ip - (long)pBVar1;
  pUVar2 = ms->hashTable;
  uVar7 = ms->nextToUpdate;
  uVar20 = (ulong)uVar7;
  uVar15 = (uint)uVar17;
  uVar14 = uVar15 - uVar5;
  if (uVar15 < uVar5 || uVar14 == 0) {
    uVar14 = uVar7;
  }
  pUVar12 = ms->chainTable;
  uVar6 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar5 = 0xff;
  if (uVar6 < 0xff) {
    uVar5 = uVar6;
  }
  cVar3 = (char)(ms->cParams).hashLog;
  bVar9 = cVar3 - 2;
  lVar8 = 1L << (bVar9 & 0x3f);
  uVar10 = 3 << (bVar9 & 0x1f);
  uVar13 = uVar15 - uVar10;
  if (uVar15 < uVar10 || uVar13 == 0) {
    uVar13 = uVar7;
  }
  if (uVar7 < uVar15) {
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        lVar23 = -0x30e4432345000000;
        break;
      case 6:
        lVar23 = -0x30e4432340650000;
        break;
      case 7:
        lVar23 = -0x30e44323405a9d00;
        break;
      case 8:
        uVar22 = *(long *)(pBVar1 + uVar20) * -0x30e44323485a9b9d;
        goto LAB_001cc086;
      default:
        uVar22 = (ulong)((uint)(*(int *)(pBVar1 + uVar20) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f));
        goto LAB_001cc08b;
      }
      uVar22 = lVar23 * *(long *)(pBVar1 + uVar20);
LAB_001cc086:
      uVar22 = uVar22 >> (0x42U - cVar3 & 0x3f);
LAB_001cc08b:
      if (uVar13 <= uVar20) {
        pUVar2[lVar8 + (ulong)((U32)uVar20 - uVar13)] = pUVar2[uVar22 & 0xffffffff];
      }
      pUVar2[uVar22 & 0xffffffff] = (U32)uVar20;
      uVar20 = uVar20 + 1;
    } while (uVar20 < (uVar17 & 0xffffffff));
  }
  uVar10 = 1 << (bVar9 & 0x1f);
  uVar22 = (ulong)uVar10;
  iVar24 = uVar5 + (uVar5 == 0);
  uVar20 = 0;
  uVar7 = 0;
  do {
    uVar5 = pUVar2[uVar20];
    bVar25 = true;
    uVar16 = 0;
    if (uVar13 <= uVar5) {
      uVar18 = 0;
      do {
        uVar16 = uVar16 + (uVar5 < uVar14);
        uVar21 = uVar18 + 1;
        uVar5 = pUVar2[lVar8 + (ulong)(uVar5 - uVar13)];
        if (uVar5 < uVar13) break;
        bVar25 = uVar18 < 2;
        uVar18 = uVar21;
      } while (bVar25);
      bVar25 = uVar21 != 3 || uVar6 == 0;
    }
    iVar19 = 0;
    if (!bVar25) {
      iVar19 = 0;
      uVar18 = uVar7;
      do {
        uVar7 = uVar18;
        if ((uVar5 < uVar14) && ((uVar5 == 0 || (uVar16 = uVar16 + 1, 3 < uVar16))))
        goto LAB_001cc163;
        pUVar12[uVar7] = uVar5;
        iVar19 = iVar19 + 1;
        iVar4 = iVar19;
        if (uVar5 < uVar13) break;
        uVar5 = pUVar2[lVar8 + (ulong)(uVar5 - uVar13)];
        uVar18 = uVar7 + 1;
        iVar4 = iVar24;
      } while (iVar24 != iVar19);
      iVar19 = iVar4;
      uVar7 = uVar7 + 1;
    }
LAB_001cc163:
    UVar11 = uVar7 * 0x100 + iVar19 * -0xff;
    if (iVar19 == 0) {
      UVar11 = 0;
    }
    pUVar2[uVar20] = UVar11;
    uVar20 = uVar20 + 1;
  } while (uVar20 != uVar22);
  uVar7 = 4 << (bVar9 & 0x1f);
  pUVar12 = pUVar2 + (uVar10 - 1);
  uVar14 = uVar10 * 4 - 1;
  do {
    uVar7 = uVar7 - 4;
    UVar11 = *pUVar12;
    pUVar12 = pUVar12 + -1;
    uVar20 = (ulong)uVar14;
    uVar14 = uVar14 - 4;
    pUVar2[(ulong)uVar7 + 2] = 0;
    (pUVar2 + uVar7)[0] = 0;
    (pUVar2 + uVar7)[1] = 0;
    pUVar2[uVar20] = UVar11;
    uVar5 = (int)uVar22 - 1;
    uVar22 = (ulong)uVar5;
  } while (uVar5 != 0);
  uVar20 = (ulong)ms->nextToUpdate;
  if (ms->nextToUpdate < uVar15) {
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        uVar22 = *(long *)(pBVar1 + uVar20) * -0x30e4432345000000;
        break;
      case 6:
        uVar22 = *(long *)(pBVar1 + uVar20) * -0x30e4432340650000;
        break;
      case 7:
        uVar22 = *(long *)(pBVar1 + uVar20) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar22 = *(long *)(pBVar1 + uVar20) * -0x30e44323485a9b9d;
        break;
      default:
        uVar7 = (uint)(*(int *)(pBVar1 + uVar20) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f);
        goto LAB_001cc285;
      }
      uVar7 = (uint)(uVar22 >> (0x42U - cVar3 & 0x3f));
LAB_001cc285:
      lVar8 = 2;
      do {
        pUVar2[(ulong)(uVar7 & 0x3fffffff) * 4 + lVar8] =
             pUVar2[(ulong)(uVar7 & 0x3fffffff) * 4 + lVar8 + -1];
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      pUVar2[uVar7 * 4] = (U32)uVar20;
      uVar20 = uVar20 + 1;
    } while (uVar20 < (uVar17 & 0xffffffff));
  }
  ms->nextToUpdate = uVar15;
  return;
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = ((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}